

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLutmin.c
# Opt level: O1

Abc_Obj_t * Abc_NtkBddDecompose(Abc_Ntk_t *pNtkNew,Abc_Obj_t *pNode,int nLutSize,int fVerbose)

{
  int iVar1;
  DdManager *dd;
  int *piVar2;
  void **ppvVar3;
  int iVar4;
  Abc_Obj_t *pAVar5;
  Vec_Ptr_t *vCofs;
  Vec_Ptr_t *vUniq;
  void **__dest;
  size_t sVar6;
  size_t __nmemb;
  long lVar7;
  Abc_Obj_t *pCofs [20];
  Abc_Obj_t *local_d8;
  undefined8 local_d0;
  undefined8 auStack_c8 [19];
  
  iVar4 = (pNode->vFanins).nSize;
  if (iVar4 <= nLutSize) {
    __assert_fail("Abc_ObjFaninNum(pNode) > nLutSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcLutmin.c"
                  ,0x253,"Abc_Obj_t *Abc_NtkBddDecompose(Abc_Ntk_t *, Abc_Obj_t *, int, int)");
  }
  dd = (DdManager *)pNode->pNtk->pManFunc;
  if ((iVar4 == nLutSize + 1) &&
     (pAVar5 = Abc_NtkBddFindCofactor(pNtkNew,pNode,nLutSize), pAVar5 != (Abc_Obj_t *)0x0)) {
    if (fVerbose != 0) {
      printf("Decomposing %d-input node %d using MUX.\n",(ulong)(uint)(pNode->vFanins).nSize,
             (ulong)(uint)pNode->Id);
    }
  }
  else {
    vCofs = Abc_NtkBddCofactors(dd,(DdNode *)(pNode->field_5).pData,nLutSize);
    vUniq = (Vec_Ptr_t *)malloc(0x10);
    iVar4 = vCofs->nSize;
    __nmemb = (size_t)iVar4;
    vUniq->nSize = iVar4;
    iVar1 = vCofs->nCap;
    vUniq->nCap = iVar1;
    if ((long)iVar1 == 0) {
      __dest = (void **)0x0;
    }
    else {
      __dest = (void **)malloc((long)iVar1 << 3);
    }
    vUniq->pArray = __dest;
    memcpy(__dest,vCofs->pArray,__nmemb * 8);
    if (1 < iVar4) {
      qsort(__dest,__nmemb,8,Vec_PtrSortCompare);
      iVar4 = 1;
      sVar6 = 1;
      do {
        if (__dest[sVar6] != __dest[sVar6 - 1]) {
          lVar7 = (long)iVar4;
          iVar4 = iVar4 + 1;
          __dest[lVar7] = __dest[sVar6];
        }
        sVar6 = sVar6 + 1;
      } while (__nmemb != sVar6);
      vUniq->nSize = iVar4;
    }
    if (1 << ((char)nLutSize - 2U & 0x1f) < vUniq->nSize) {
      if (vCofs->pArray != (void **)0x0) {
        free(vCofs->pArray);
        vCofs->pArray = (void **)0x0;
      }
      free(vCofs);
      vCofs = Abc_NtkBddCofactors(dd,(DdNode *)(pNode->field_5).pData,2);
      if (fVerbose != 0) {
        printf("Decomposing %d-input node %d using cofactoring with %d cofactors.\n",
               (ulong)(uint)(pNode->vFanins).nSize,(ulong)(uint)pNode->Id,(ulong)(uint)vCofs->nSize)
        ;
      }
      piVar2 = (pNode->vFanins).pArray;
      ppvVar3 = pNode->pNtk->vObjs->pArray;
      local_d8 = *(Abc_Obj_t **)((long)ppvVar3[*piVar2] + 0x40);
      local_d0 = *(undefined8 *)((long)ppvVar3[piVar2[1]] + 0x40);
      if (0 < vCofs->nSize) {
        lVar7 = 0;
        do {
          pAVar5 = Abc_NtkCreateCofLut(pNtkNew,dd,(DdNode *)vCofs->pArray[lVar7],pNode,2);
          auStack_c8[lVar7] = pAVar5;
          lVar7 = lVar7 + 1;
        } while (lVar7 < vCofs->nSize);
      }
      if (nLutSize == 6) {
        pAVar5 = Abc_NtkBddMux411(pNtkNew,&local_d8);
      }
      else if (nLutSize == 5) {
        pAVar5 = Abc_NtkBddMux412a(pNtkNew,&local_d8);
      }
      else {
        if (nLutSize != 4) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcLutmin.c"
                        ,0x279,"Abc_Obj_t *Abc_NtkBddDecompose(Abc_Ntk_t *, Abc_Obj_t *, int, int)")
          ;
        }
        pAVar5 = Abc_NtkBddMux412(pNtkNew,&local_d8);
      }
    }
    else {
      if (fVerbose != 0) {
        printf("Decomposing %d-input node %d using Curtis with %d unique columns.\n",
               (ulong)(uint)(pNode->vFanins).nSize,(ulong)(uint)pNode->Id,(ulong)(uint)vUniq->nSize)
        ;
      }
      pAVar5 = Abc_NtkBddCurtis(pNtkNew,pNode,vCofs,vUniq);
    }
    if (vCofs->pArray != (void **)0x0) {
      free(vCofs->pArray);
      vCofs->pArray = (void **)0x0;
    }
    if (vCofs != (Vec_Ptr_t *)0x0) {
      free(vCofs);
    }
    if (__dest != (void **)0x0) {
      free(__dest);
      vUniq->pArray = (void **)0x0;
    }
    free(vUniq);
  }
  return pAVar5;
}

Assistant:

Abc_Obj_t * Abc_NtkBddDecompose( Abc_Ntk_t * pNtkNew, Abc_Obj_t * pNode, int nLutSize, int fVerbose )
{
    Vec_Ptr_t * vCofs, * vUniq;
    DdManager * dd = (DdManager *)pNode->pNtk->pManFunc;
    DdNode * bCof;
    Abc_Obj_t * pNodeNew = NULL;
    Abc_Obj_t * pCofs[20];
    int i;
    assert( Abc_ObjFaninNum(pNode) > nLutSize );
    // try to decompose with two LUTs (the best case for Supp = LutSize + 1)
    if ( Abc_ObjFaninNum(pNode) == nLutSize + 1 )
    {

        pNodeNew = Abc_NtkBddFindCofactor( pNtkNew, pNode, nLutSize );
        if ( pNodeNew != NULL )
        {
            if ( fVerbose )
            printf( "Decomposing %d-input node %d using MUX.\n",
                Abc_ObjFaninNum(pNode), Abc_ObjId(pNode) );
            return pNodeNew;
        }

    }
    // cofactor w.r.t. the bound set variables
    vCofs = Abc_NtkBddCofactors( dd, (DdNode *)pNode->pData, nLutSize );
    vUniq = Vec_PtrDup( vCofs );
    Vec_PtrUniqify( vUniq, (int (*)())Vec_PtrSortCompare );
    // only perform decomposition with it is support reduring with two less vars
    if( Vec_PtrSize(vUniq) > (1 << (nLutSize-2)) )
    {
        Vec_PtrFree( vCofs );
        vCofs = Abc_NtkBddCofactors( dd, (DdNode *)pNode->pData, 2 );
        if ( fVerbose )
        printf( "Decomposing %d-input node %d using cofactoring with %d cofactors.\n",
            Abc_ObjFaninNum(pNode), Abc_ObjId(pNode), Vec_PtrSize(vCofs) );
        // implement the cofactors
        pCofs[0] = Abc_ObjFanin(pNode, 0)->pCopy;
        pCofs[1] = Abc_ObjFanin(pNode, 1)->pCopy;
        Vec_PtrForEachEntry( DdNode *, vCofs, bCof, i )
            pCofs[2+i] = Abc_NtkCreateCofLut( pNtkNew, dd, bCof, pNode, 2 );
        if ( nLutSize == 4 )
            pNodeNew = Abc_NtkBddMux412( pNtkNew, pCofs );
        else if ( nLutSize == 5 )
            pNodeNew = Abc_NtkBddMux412a( pNtkNew, pCofs );
        else if ( nLutSize == 6 )
            pNodeNew = Abc_NtkBddMux411( pNtkNew, pCofs );
        else  assert( 0 );
    }
    // alternative decompose using MUX-decomposition
    else
    {
        if ( fVerbose )
        printf( "Decomposing %d-input node %d using Curtis with %d unique columns.\n",
            Abc_ObjFaninNum(pNode), Abc_ObjId(pNode), Vec_PtrSize(vUniq) );
        pNodeNew = Abc_NtkBddCurtis( pNtkNew, pNode, vCofs, vUniq );
    }
    Vec_PtrFree( vCofs );
    Vec_PtrFree( vUniq );
    return pNodeNew;
}